

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::recursive_sort(DataSet *this,uint col,uint beg_row,uint end_row)

{
  uint end_row_00;
  
  if ((beg_row < end_row) && (col < (this->m_matrix).m_shape.n_col)) {
    sort_column(&this->m_matrix,col,beg_row,end_row);
    while ((beg_row < end_row && (col < (this->m_matrix).m_shape.n_col - 1))) {
      end_row_00 = diff_index(&this->m_matrix,col,beg_row,end_row);
      recursive_sort(this,col + 1,beg_row,end_row_00);
      beg_row = end_row_00;
    }
  }
  return;
}

Assistant:

void DataSet::recursive_sort(unsigned col, unsigned beg_row, unsigned end_row){
    if(col>=m_matrix.shape().n_col || beg_row>=end_row) return ;

    sort_column(m_matrix, col, beg_row, end_row);
    for(;beg_row<end_row && col<m_matrix.shape().n_col-1;){
        unsigned tmp_end_row=diff_index(m_matrix, col, beg_row, end_row);
        recursive_sort(col+1, beg_row, tmp_end_row);
        beg_row=tmp_end_row;
    }
}